

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<kj::Directory,_std::nullptr_t> __thiscall
kj::newInMemoryDirectory(kj *this,Clock *clock,InMemoryFileFactory *fileFactory)

{
  int iVar1;
  undefined8 *puVar2;
  undefined4 extraout_var;
  Directory *extraout_RDX;
  AtomicRefcounted *refcounted;
  Own<kj::Directory,_std::nullptr_t> OVar3;
  
  puVar2 = (undefined8 *)operator_new(0x78);
  *(undefined4 *)(puVar2 + 2) = 0;
  *puVar2 = &PTR_getFd_00626e00;
  puVar2[1] = &DAT_00626ed8;
  _::Mutex::Mutex((Mutex *)(puVar2 + 3));
  puVar2[6] = clock;
  puVar2[7] = fileFactory;
  *(undefined4 *)(puVar2 + 9) = 0;
  puVar2[10] = 0;
  puVar2[0xb] = puVar2 + 9;
  puVar2[0xc] = puVar2 + 9;
  puVar2[0xd] = 0;
  iVar1 = (**clock->_vptr_Clock)(clock);
  puVar2[0xe] = CONCAT44(extraout_var,iVar1);
  LOCK();
  *(int *)(puVar2 + 2) = *(int *)(puVar2 + 2) + 1;
  UNLOCK();
  *(undefined8 **)this = puVar2 + 1;
  *(undefined8 **)(this + 8) = puVar2;
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<Directory> newInMemoryDirectory(const Clock& clock, const InMemoryFileFactory& fileFactory) {
  return atomicRefcounted<InMemoryDirectory>(clock, fileFactory);
}